

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

charcount_t __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::UpdateLine
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,int32 *line,EncodedCharPtr start,
          EncodedCharPtr last,charcount_t ichStart,charcount_t ichEnd)

{
  charcount_t cVar1;
  OLECHAR OVar2;
  UTF8EncodingPolicyBase<false> *this_00;
  charcount_t cVar3;
  int32 iVar4;
  byte *local_58;
  int32 *local_50;
  charcount_t local_44;
  byte *local_40;
  EncodedCharPtr p;
  
  iVar4 = *line;
  local_50 = line;
  if (ichStart < ichEnd) {
    this_00 = &this->super_UTF8EncodingPolicyBase<false>;
    cVar3 = ichStart;
    local_44 = ichEnd;
    local_40 = start;
    p = last;
    do {
      cVar1 = cVar3 + 1;
      OVar2 = UTF8EncodingPolicyBase<false>::ReadFull<false>(this_00,&local_40,p);
      if ((ushort)OVar2 < 0x2028) {
        if ((ushort)OVar2 != 10) {
          if (OVar2 != L'\r') {
            cVar3 = cVar1;
            if (OVar2 != L'\0') goto LAB_00f15618;
            break;
          }
          local_58 = local_40;
          if (local_40 < p) {
            OVar2 = (OLECHAR)*local_40;
          }
          else {
            OVar2 = L'\0';
          }
          if (0x7f < (ushort)OVar2) {
            OVar2 = UTF8EncodingPolicyBase<false>::ReadFull<false>(this_00,&local_58,p);
          }
          if (OVar2 == L'\n') {
            UTF8EncodingPolicyBase<false>::ReadFull<false>(this_00,&local_40,p);
            cVar1 = cVar3 + 2;
          }
        }
LAB_00f1560f:
        ichStart = cVar1;
        iVar4 = iVar4 + 1;
        cVar3 = ichStart;
      }
      else {
        cVar3 = cVar1;
        if ((ushort)OVar2 - 0x2028 < 2) goto LAB_00f1560f;
      }
LAB_00f15618:
    } while (cVar3 < local_44);
  }
  *local_50 = iVar4;
  return ichStart;
}

Assistant:

charcount_t Scanner<EncodingPolicy>::UpdateLine(int32 &line, EncodedCharPtr start, EncodedCharPtr last, charcount_t ichStart, charcount_t ichEnd)
{
    EncodedCharPtr p = start;
    charcount_t ich = ichStart;
    int32 current = line;
    charcount_t lastStart = ichStart;

    while (ich < ichEnd)
    {
        ich++;
        switch (this->template ReadFull<false>(p, last))
        {
        case kchRET:
            if (this->PeekFull(p, last) == kchNWL)
            {
                ich++;
                this->template ReadFull<false>(p, last);
            }
            // fall-through

        case kchNWL:
        case kchLS:
        case kchPS:
            current++;
            lastStart = ich;
            break;

        case kchNUL:
            goto done;
        }
    }

done:
    line = current;
    return lastStart;
}